

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_ARB1_srcarg_string(Context *ctx,size_t idx,char *buf,size_t buflen)

{
  SourceArgInfo *arg;
  size_t buflen_local;
  char *buf_local;
  size_t idx_local;
  Context *ctx_local;
  
  if (idx < 5) {
    ctx_local = (Context *)make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + idx,buf,buflen);
  }
  else {
    fail(ctx,"Too many source args");
    *buf = '\0';
    ctx_local = (Context *)buf;
  }
  return (char *)ctx_local;
}

Assistant:

static const char *make_ARB1_srcarg_string(Context *ctx, const size_t idx,
                                           char *buf, const size_t buflen)
{
    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        *buf = '\0';
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];
    return make_ARB1_srcarg_string_in_buf(ctx, arg, buf, buflen);
}